

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS ref_layer_puff(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  int iVar1;
  REF_GRID pRVar2;
  REF_NODE ref_node;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  REF_ADJ pRVar5;
  REF_ADJ_ITEM pRVar6;
  REF_LAYER pRVar7;
  int iVar8;
  uint uVar9;
  REF_LIST pRVar10;
  long lVar11;
  undefined8 uVar12;
  REF_INT RVar13;
  REF_CELL pRVar14;
  ulong uVar15;
  double dVar16;
  REF_CELL pRVar17;
  char *pcVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  REF_INT node;
  REF_INT new_cell;
  REF_DBL angle;
  REF_BOOL contains1;
  REF_BOOL contains0;
  REF_DBL norm [3];
  REF_INT ncell;
  REF_INT nodes [27];
  REF_INT edge_nodes [27];
  REF_INT prism [27];
  REF_INT local_20c;
  int local_208;
  int local_204;
  REF_LAYER local_200;
  undefined8 local_1f8;
  REF_CELL local_1f0;
  REF_CELL local_1e8;
  REF_CELL local_1e0;
  int local_1d8;
  int local_1d4;
  long local_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  REF_DBL local_1b8;
  double dStack_1b0;
  double local_1a8;
  int local_194;
  REF_CELL local_190;
  REF_INT local_188 [28];
  undefined8 local_118;
  REF_INT local_110;
  REF_INT local_a8 [3];
  int aiStack_9c [27];
  
  pRVar17 = ref_grid->cell[3];
  pRVar2 = ref_layer->ref_grid;
  ref_node = pRVar2->node;
  local_190 = pRVar2->cell[0];
  local_1e0 = pRVar2->cell[10];
  pRVar10 = ref_layer->ref_list;
  local_200 = ref_layer;
  local_1f0 = pRVar17;
  if (0 < pRVar10->n) {
    dVar16 = 0.0;
    do {
      local_1c8 = dVar16;
      uVar9 = ref_cell_nodes(pRVar17,pRVar10->value[(long)dVar16],local_188);
      if (uVar9 != 0) {
        uVar15 = (ulong)uVar9;
        pcVar18 = "nodes";
        uVar12 = 0x85;
        goto LAB_002007a2;
      }
      if (0 < pRVar17->node_per) {
        lVar19 = 0;
        do {
          uVar9 = ref_node_add(ref_node,(long)local_188[lVar19],&local_208);
          if (uVar9 != 0) {
            uVar15 = (ulong)uVar9;
            pcVar18 = "add";
            uVar12 = 0x87;
            goto LAB_002007a2;
          }
          iVar1 = local_188[lVar19];
          pRVar3 = ref_grid->node->real;
          pRVar4 = ref_node->real;
          lVar11 = 0;
          do {
            pRVar4[(long)local_208 * 0xf + lVar11] = pRVar3[(long)iVar1 * 0xf + lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          lVar19 = lVar19 + 1;
          pRVar17 = local_1f0;
        } while (lVar19 < local_1f0->node_per);
      }
      dVar16 = (double)((long)local_1c8 + 1);
      pRVar10 = local_200->ref_list;
    } while ((long)dVar16 < (long)pRVar10->n);
  }
  iVar1 = ref_node->n;
  local_200->nnode_per_layer = iVar1;
  local_20c = 0;
  if (0 < iVar1) {
    do {
      uVar9 = ref_node_add(ref_node,(long)local_20c + ref_grid->node->old_n_global,&local_208);
      if (uVar9 != 0) {
        uVar15 = (ulong)uVar9;
        pcVar18 = "add";
        uVar12 = 0x93;
        goto LAB_002007a2;
      }
      if (((-1 < (long)local_20c) && (local_20c < ref_node->max)) &&
         (lVar19 = ref_node->global[local_20c], -1 < lVar19)) {
        local_1b8 = 0.0;
        dStack_1b0 = 0.0;
        local_1a8 = 0.0;
        uVar9 = (uint)lVar19;
        if (((int)uVar9 < 0) || (pRVar5 = ref_grid->cell[3]->ref_adj, pRVar5->nnode <= (int)uVar9))
        {
          dVar16 = 0.0;
          goto LAB_002001ad;
        }
        lVar11 = (long)pRVar5->first[uVar9 & 0x7fffffff];
        dVar16 = 0.0;
        if (lVar11 == -1) goto LAB_002001ad;
        RVar13 = pRVar5->item[lVar11].ref;
        local_1e8 = ref_grid->cell[3];
        local_1d0 = lVar19;
        uVar9 = ref_list_contains(local_200->ref_list,RVar13,&local_204);
        if (uVar9 == 0) {
          dVar16 = 0.0;
          uVar12 = 0;
          while( true ) {
            if (local_204 != 0) {
              local_1c8 = dVar16;
              uStack_1c0 = uVar12;
              uVar9 = ref_cell_nodes(local_1e8,RVar13,local_a8);
              if (uVar9 != 0) {
                uVar15 = (ulong)uVar9;
                pcVar18 = "tri nodes";
                uVar12 = 0x60;
                goto LAB_00200777;
              }
              uVar9 = ref_node_tri_node_angle
                                (ref_grid->node,local_a8,(REF_INT)local_1d0,(REF_DBL *)&local_1f8);
              if (uVar9 != 0) {
                uVar15 = (ulong)uVar9;
                pcVar18 = "angle";
                uVar12 = 0x62;
                goto LAB_00200777;
              }
              uVar9 = ref_node_tri_normal(ref_grid->node,local_a8,(REF_DBL *)&local_118);
              if (uVar9 != 0) {
                uVar15 = (ulong)uVar9;
                pcVar18 = "norm";
                uVar12 = 100;
                goto LAB_00200777;
              }
              uVar9 = ref_math_normalize((REF_DBL *)&local_118);
              if (uVar9 != 0) {
                uVar15 = (ulong)uVar9;
                pcVar18 = "normalize tri norm";
                uVar12 = 0x65;
                goto LAB_00200777;
              }
              lVar19 = 0;
              do {
                (&local_1b8)[lVar19] =
                     (double)(&local_118)[lVar19] *
                     (double)CONCAT44(local_1f8._4_4_,(REF_INT)local_1f8) + (&local_1b8)[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              dVar16 = local_1c8 + (double)CONCAT44(local_1f8._4_4_,(REF_INT)local_1f8);
              uVar12 = uStack_1c0;
            }
            pRVar6 = local_1e8->ref_adj->item;
            lVar11 = (long)pRVar6[(int)lVar11].next;
            if (lVar11 == -1) break;
            RVar13 = pRVar6[lVar11].ref;
            local_1c8 = dVar16;
            uStack_1c0 = uVar12;
            uVar9 = ref_list_contains(local_200->ref_list,RVar13,&local_204);
            dVar16 = local_1c8;
            uVar12 = uStack_1c0;
            if (uVar9 != 0) goto LAB_0020066d;
          }
          goto LAB_002001ad;
        }
LAB_0020066d:
        uVar15 = (ulong)uVar9;
        pcVar18 = "in layer";
        uVar12 = 0x5e;
LAB_00200777:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               uVar12,"ref_layer_normal",uVar15,pcVar18);
LAB_00200781:
        pcVar18 = "normal";
        uVar12 = 0x96;
        goto LAB_002007a2;
      }
      local_1b8 = 0.0;
      dStack_1b0 = 0.0;
      local_1a8 = 0.0;
      dVar16 = 0.0;
LAB_002001ad:
      auVar22._0_8_ = dVar16 * 1e+20;
      auVar22._8_8_ = local_1b8;
      auVar23._8_8_ = -local_1b8;
      auVar23._0_8_ = -auVar22._0_8_;
      auVar23 = maxpd(auVar22,auVar23);
      uVar15 = 4;
      dVar21 = auVar23._0_8_;
      if (dVar21 <= auVar23._8_8_) goto LAB_00200781;
      dVar20 = dStack_1b0;
      if (dStack_1b0 <= -dStack_1b0) {
        dVar20 = -dStack_1b0;
      }
      if (dVar21 <= dVar20) goto LAB_00200781;
      dVar20 = local_1a8;
      if (local_1a8 <= -local_1a8) {
        dVar20 = -local_1a8;
      }
      if (dVar21 <= dVar20) goto LAB_00200781;
      lVar19 = 0;
      do {
        (&local_1b8)[lVar19] = (&local_1b8)[lVar19] / dVar16;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      uVar9 = ref_math_normalize(&local_1b8);
      if (uVar9 != 0) {
        uVar15 = (ulong)uVar9;
        pcVar18 = "normalize average norm";
        uVar12 = 0x71;
        goto LAB_00200777;
      }
      pRVar3 = ref_node->real;
      lVar19 = 0;
      do {
        pRVar3[(long)local_208 * 0xf + lVar19] =
             (&local_1b8)[lVar19] * 0.1 + pRVar3[(long)local_20c * 0xf + lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      local_20c = local_20c + 1;
    } while (local_20c < iVar1);
    pRVar10 = local_200->ref_list;
    pRVar17 = local_1f0;
  }
  if (0 < pRVar10->n) {
    local_1c8 = (double)CONCAT44(local_1c8._4_4_,iVar1);
    lVar19 = 0;
    do {
      uVar9 = ref_cell_nodes(pRVar17,pRVar10->value[lVar19],local_188);
      if (uVar9 != 0) {
        uVar15 = (ulong)uVar9;
        pcVar18 = "nodes";
        uVar12 = 0x9f;
        goto LAB_002007a2;
      }
      if (0 < pRVar17->node_per) {
        lVar11 = 0;
        do {
          uVar9 = ref_node_local(ref_node,(long)local_188[lVar11],&local_20c);
          if (uVar9 != 0) {
            uVar15 = (ulong)uVar9;
            pcVar18 = "local";
            uVar12 = 0xa1;
            goto LAB_002007a2;
          }
          local_a8[lVar11] = local_20c;
          aiStack_9c[lVar11] = local_20c + local_1c8._0_4_;
          lVar11 = lVar11 + 1;
        } while (lVar11 < local_1f0->node_per);
      }
      uVar9 = ref_cell_add(local_1e0,local_a8,&local_204);
      if (uVar9 != 0) {
        uVar15 = (ulong)uVar9;
        pcVar18 = "add";
        uVar12 = 0xa5;
        goto LAB_002007a2;
      }
      lVar19 = lVar19 + 1;
      pRVar10 = local_200->ref_list;
      pRVar17 = local_1f0;
    } while (lVar19 < pRVar10->n);
    if (0 < pRVar10->n) {
      pRVar14 = (REF_CELL)0x0;
      while( true ) {
        local_1e0 = (REF_CELL)CONCAT44(local_1e0._4_4_,pRVar10->value[(long)pRVar14]);
        uVar9 = ref_cell_nodes(pRVar17,pRVar10->value[(long)pRVar14],local_188);
        if (uVar9 != 0) break;
        local_1e8 = pRVar14;
        if (0 < pRVar17->edge_per) {
          local_1d0 = (long)(int)local_1e0;
          lVar19 = 0;
          do {
            RVar13 = local_188[pRVar17->e2n[lVar19 * 2]];
            iVar1 = local_188[pRVar17->e2n[lVar19 * 2 + 1]];
            uVar9 = ref_cell_list_with2(pRVar17,RVar13,iVar1,2,&local_194,(REF_INT *)&local_1f8);
            pRVar7 = local_200;
            if (uVar9 != 0) {
              uVar15 = (ulong)uVar9;
              pcVar18 = "find with 2";
              uVar12 = 0xb5;
              goto LAB_002007a2;
            }
            lVar11 = (long)local_194;
            if (lVar11 != 2) {
              pcVar18 = "expected two tri for tri side";
              lVar19 = 2;
              uVar12 = 0xb6;
              goto LAB_00200983;
            }
            uVar9 = ref_list_contains(local_200->ref_list,(REF_INT)local_1f8,&local_1d4);
            if (uVar9 != 0) {
              uVar15 = (ulong)uVar9;
              pcVar18 = "0 in layer";
              uVar12 = 0xb9;
              goto LAB_002007a2;
            }
            uVar9 = ref_list_contains(pRVar7->ref_list,local_1f8._4_4_,&local_1d8);
            if (uVar9 != 0) {
              uVar15 = (ulong)uVar9;
              pcVar18 = "1 in layer";
              uVar12 = 0xbc;
              goto LAB_002007a2;
            }
            if (local_1d4 == 0 || local_1d8 == 0) {
              if (local_1d4 == 0 && local_1d8 == 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0xbe,"ref_layer_puff","tri side is not in layer");
                return 1;
              }
              uVar9 = ref_node_local(ref_node,(long)RVar13,&local_20c);
              if (uVar9 != 0) {
                uVar15 = (ulong)uVar9;
                pcVar18 = "local";
                uVar12 = 0xbf;
                goto LAB_002007a2;
              }
              iVar8 = local_1c8._0_4_;
              local_118._0_4_ = local_20c + local_1c8._0_4_;
              uVar9 = ref_node_local(ref_node,(long)iVar1,&local_20c);
              if (uVar9 != 0) {
                uVar15 = (ulong)uVar9;
                pcVar18 = "local";
                uVar12 = 0xc1;
                goto LAB_002007a2;
              }
              local_118._4_4_ = local_20c + iVar8;
              if (local_1d4 != 0) {
                if ((int)local_1e0 == (REF_INT)local_1f8) {
                  local_110 = local_1f0->c2n[(long)local_1f8._4_4_ * (long)local_1f0->size_per + 3];
                  goto LAB_002005aa;
                }
                uVar12 = 0xc4;
                local_1f8._4_4_ = (REF_INT)local_1f8;
LAB_0020097e:
                lVar11 = (long)local_1f8._4_4_;
                pcVar18 = "cell should be in layer";
                lVar19 = local_1d0;
LAB_00200983:
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,uVar12,"ref_layer_puff",pcVar18,lVar19,lVar11);
                return 1;
              }
LAB_002005aa:
              if (local_1d8 != 0) {
                if ((int)local_1e0 != local_1f8._4_4_) {
                  uVar12 = 200;
                  goto LAB_0020097e;
                }
                local_110 = local_1f0->c2n[(long)(REF_INT)local_1f8 * (long)local_1f0->size_per + 3]
                ;
              }
              uVar9 = ref_cell_add(local_190,(REF_INT *)&local_118,&local_204);
              if (uVar9 != 0) {
                uVar15 = (ulong)uVar9;
                pcVar18 = "add";
                uVar12 = 0xcb;
                goto LAB_002007a2;
              }
            }
            lVar19 = lVar19 + 1;
            pRVar17 = local_1f0;
          } while (lVar19 < local_1f0->edge_per);
        }
        pRVar14 = (REF_CELL)((long)&local_1e8->type + 1);
        pRVar10 = local_200->ref_list;
        if ((long)pRVar10->n <= (long)pRVar14) {
          return 0;
        }
      }
      uVar15 = (ulong)uVar9;
      pcVar18 = "nodes";
      uVar12 = 0xab;
LAB_002007a2:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uVar12,"ref_layer_puff",uVar15,pcVar18);
      return (REF_STATUS)uVar15;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_layer_puff(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_CELL layer_prism = ref_grid_pri(ref_layer_grid(ref_layer));
  REF_CELL layer_edge = ref_grid_edg(ref_layer_grid(ref_layer));
  REF_INT item, cell, cell_node, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT prism[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT node, local, i, nnode_per_layer;
  REF_GLOB global;
  REF_DBL norm[3];

  /* first layer of nodes */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_node_add(layer_node, nodes[cell_node], &node), "add");
      for (i = 0; i < 3; i++)
        ref_node_xyz(layer_node, i, node) =
            ref_node_xyz(ref_grid_node(ref_grid), i, nodes[cell_node]);
    }
  }
  nnode_per_layer = ref_node_n(layer_node);
  ref_layer->nnode_per_layer = nnode_per_layer;

  /* second layer of nodes */
  for (local = 0; local < nnode_per_layer; local++) {
    global = (REF_GLOB)local + ref_node_n_global(ref_grid_node(ref_grid));
    RSS(ref_node_add(layer_node, global, &node), "add");
    RSS(ref_layer_normal(ref_layer, ref_grid,
                         (REF_INT)ref_node_global(layer_node, local), norm),
        "normal");
    for (i = 0; i < 3; i++)
      ref_node_xyz(layer_node, i, node) =
          0.1 * norm[i] + ref_node_xyz(layer_node, i, local);
  }

  /* layer of prisms */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_node_local(layer_node, nodes[cell_node], &local), "local");
      prism[cell_node] = local;
      prism[3 + cell_node] = local + nnode_per_layer;
    }
    RSS(ref_cell_add(layer_prism, prism, &new_cell), "add");
  }

  /* constrain faces */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      REF_INT node0;
      REF_INT node1;
      REF_INT ncell, cell_list[2];
      REF_BOOL contains0, contains1;
      REF_INT edge_nodes[REF_CELL_MAX_SIZE_PER];
      node0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      node1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_list),
          "find with 2");
      REIS(2, ncell, "expected two tri for tri side");
      RSS(ref_list_contains(ref_layer_list(ref_layer), cell_list[0],
                            &contains0),
          "0 in layer");
      RSS(ref_list_contains(ref_layer_list(ref_layer), cell_list[1],
                            &contains1),
          "1 in layer");
      if (contains0 && contains1) continue; /* tri side interior to layer */
      if (!contains0 && !contains1) THROW("tri side is not in layer");
      RSS(ref_node_local(layer_node, node0, &local), "local");
      edge_nodes[0] = local + nnode_per_layer;
      RSS(ref_node_local(layer_node, node1, &local), "local");
      edge_nodes[1] = local + nnode_per_layer;
      if (contains0) {
        REIS(cell, cell_list[0], "cell should be in layer");
        edge_nodes[2] = ref_cell_c2n(ref_cell, 3, cell_list[1]);
      }
      if (contains1) {
        REIS(cell, cell_list[1], "cell should be in layer");
        edge_nodes[2] = ref_cell_c2n(ref_cell, 3, cell_list[0]);
      }
      RSS(ref_cell_add(layer_edge, edge_nodes, &new_cell), "add");
    }
  }

  return REF_SUCCESS;
}